

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O3

void __thiscall
Catch::Capturer::captureValues<int,int,char,int,char[4]>
          (Capturer *this,size_t index,int *value,int *values,char *values_1,int *values_2,
          char (*values_3) [4])

{
  string local_50;
  
  StringMaker<int,void>::convert_abi_cxx11_
            (&local_50,(StringMaker<int,void> *)(ulong)(uint)*value,(int)value);
  captureValue(this,index,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  captureValues<int,char,int,char[4]>(this,index + 1,values,values_1,values_2,values_3);
  return;
}

Assistant:

void captureValues( size_t index, T const& value, Ts const&... values ) {
            captureValue( index, Catch::Detail::stringify(value) );
            captureValues( index+1, values... );
        }